

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

index_stream *
index_stream_init(lzma_vli compressed_base,lzma_vli uncompressed_base,uint32_t stream_number,
                 lzma_vli block_number_base,lzma_allocator *allocator)

{
  index_stream *piVar1;
  
  piVar1 = (index_stream *)lzma_alloc(0xa8,allocator);
  if (piVar1 != (index_stream *)0x0) {
    (piVar1->node).uncompressed_base = uncompressed_base;
    (piVar1->node).compressed_base = compressed_base;
    (piVar1->node).parent = (index_tree_node *)0x0;
    (piVar1->node).left = (index_tree_node *)0x0;
    (piVar1->node).right = (index_tree_node *)0x0;
    piVar1->number = stream_number;
    piVar1->block_number_base = block_number_base;
    (piVar1->groups).root = (index_tree_node *)0x0;
    (piVar1->groups).leftmost = (index_tree_node *)0x0;
    *(undefined8 *)((long)&(piVar1->groups).leftmost + 4) = 0;
    *(undefined8 *)((long)&(piVar1->groups).rightmost + 4) = 0;
    piVar1->record_count = 0;
    piVar1->index_list_size = 0;
    (piVar1->stream_flags).version = 0xffffffff;
    piVar1->stream_padding = 0;
  }
  return piVar1;
}

Assistant:

static index_stream *
index_stream_init(lzma_vli compressed_base, lzma_vli uncompressed_base,
		uint32_t stream_number, lzma_vli block_number_base,
		const lzma_allocator *allocator)
{
	index_stream *s = lzma_alloc(sizeof(index_stream), allocator);
	if (s == NULL)
		return NULL;

	s->node.uncompressed_base = uncompressed_base;
	s->node.compressed_base = compressed_base;
	s->node.parent = NULL;
	s->node.left = NULL;
	s->node.right = NULL;

	s->number = stream_number;
	s->block_number_base = block_number_base;

	index_tree_init(&s->groups);

	s->record_count = 0;
	s->index_list_size = 0;
	s->stream_flags.version = UINT32_MAX;
	s->stream_padding = 0;

	return s;
}